

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

int __thiscall IsoWriter::close(IsoWriter *this,int __fd)

{
  File *this_00;
  uint8_t *__s;
  int iVar1;
  bool bVar2;
  int64_t in_RAX;
  int64_t extraout_RAX;
  int iVar3;
  size_t in_RCX;
  size_t __n;
  ulong uVar4;
  int __fd_00;
  int iVar5;
  int64_t result;
  
  if (this->m_opened == true) {
    __s = this->m_buffer;
    result = in_RAX;
    memset(__s,0,0x800);
    this_00 = &this->m_file;
    bVar2 = File::size(this_00,&result);
    __fd_00 = (int)__s;
    while ((!bVar2 || ((result & 0x800000000000ffffU) != 0xf800))) {
      File::write(this_00,__fd_00,(void *)0x800,in_RCX);
      bVar2 = File::size(this_00,&result);
    }
    bVar2 = File::size(this_00,&result);
    uVar4 = result + 0x7ff;
    if (-1 < result) {
      uVar4 = result;
    }
    iVar5 = 1;
    if (bVar2) {
      iVar5 = (int)(uVar4 >> 0xb) + 1;
    }
    this->m_metadataMirrorLBN = iVar5;
    this->m_tagLocationBaseAddr = this->m_partitionStartAddress;
    __n = 0xfb;
    writeExtendedFileEntryDescriptor
              (this,false,'\0',MetadataMirror,(long)this->m_metadataFileLen,
               iVar5 - this->m_partitionStartAddress,0,(ExtentList *)0x0);
    memset(__s,0,0x800);
    if (0x7ff < this->m_metadataFileLen) {
      iVar5 = 0;
      do {
        File::write(this_00,__fd_00,(void *)0x800,__n);
        iVar5 = iVar5 + 1;
        iVar1 = this->m_metadataFileLen;
        iVar3 = iVar1 + 0x7ff;
        if (-1 < iVar1) {
          iVar3 = iVar1;
        }
        __n = (size_t)(uint)(iVar3 >> 0xb);
      } while (iVar5 < iVar3 >> 0xb);
    }
    bVar2 = File::size(this_00,&result);
    uVar4 = result + 0x7ff;
    if (-1 < result) {
      uVar4 = result;
    }
    iVar5 = (int)(uVar4 >> 0xb);
    if (!bVar2) {
      iVar5 = 0;
    }
    this->m_partitionEndAddress = iVar5;
    memset(__s,0,0x800);
    iVar5 = 0x20;
    do {
      File::write(this_00,__fd_00,(void *)0x800,result);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    allocateMetadata(this);
    this->m_tagLocationBaseAddr = this->m_metadataMirrorLBN;
    writeMetadata(this,this->m_metadataMirrorLBN);
    File::seek(this_00,0x90000,smBegin);
    this->m_tagLocationBaseAddr = this->m_partitionStartAddress;
    writeExtendedFileEntryDescriptor
              (this,false,'\0',Metadata,(long)this->m_metadataFileLen,
               this->m_metadataLBN - this->m_partitionStartAddress,0,(ExtentList *)0x0);
    this->m_tagLocationBaseAddr = this->m_metadataLBN;
    writeMetadata(this,this->m_metadataLBN);
    writeDescriptors(this);
    this->m_opened = false;
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void IsoWriter::close()
{
    if (!m_opened)
        return;

    memset(m_buffer, 0, sizeof(m_buffer));
    while (m_file.size() % ALLOC_BLOCK_SIZE != 1024LL * 62) m_file.write(m_buffer, SECTOR_SIZE);

    // mirror metadata file location and length
    m_metadataMirrorLBN = static_cast<int>(m_file.size() / SECTOR_SIZE + 1);
    m_tagLocationBaseAddr = m_partitionStartAddress;
    writeExtendedFileEntryDescriptor(false, 0, FileTypes::MetadataMirror, m_metadataFileLen,
                                     m_metadataMirrorLBN - m_partitionStartAddress, 0);

    // allocate space for metadata mirror file
    memset(m_buffer, 0, sizeof(m_buffer));
    for (int i = 0; i < m_metadataFileLen / SECTOR_SIZE; ++i) m_file.write(m_buffer, SECTOR_SIZE);

    m_partitionEndAddress = static_cast<int>(m_file.size() / SECTOR_SIZE);

    // reserve 64K for EOF anchor volume
    memset(m_buffer, 0, sizeof(m_buffer));
    for (int i = 0; i < 32; ++i) m_file.write(m_buffer, SECTOR_SIZE);

    allocateMetadata();

    m_tagLocationBaseAddr = m_metadataMirrorLBN;
    writeMetadata(m_metadataMirrorLBN);  // write metadata mirror file

    m_file.seek(1024LL * 576);
    // metadata file location and length (located at 576K, point to 640K address)
    m_tagLocationBaseAddr = m_partitionStartAddress;
    writeExtendedFileEntryDescriptor(false, 0, FileTypes::Metadata, m_metadataFileLen,
                                     m_metadataLBN - m_partitionStartAddress, 0);
    m_tagLocationBaseAddr = m_metadataLBN;  // Don't know why. Doing just as scenarist does
    writeMetadata(m_metadataLBN);

    writeDescriptors();
    m_opened = false;
}